

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall leveldb::anon_unknown_1::PosixWritableFile::Sync(PosixWritableFile *this)

{
  bool bVar1;
  string *in_RSI;
  PosixWritableFile *in_RDI;
  Status status;
  Status *in_stack_ffffffffffffffb8;
  PosixWritableFile *this_00;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  Status local_18 [2];
  
  this_00 = in_RDI;
  SyncDirIfManifest(in_RDI);
  bVar1 = Status::ok(local_18);
  if (bVar1) {
    FlushBuffer((PosixWritableFile *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    Status::operator=((Status *)this_00,in_stack_ffffffffffffffb8);
    Status::~Status((Status *)this_00);
    bVar1 = Status::ok(local_18);
    if (bVar1) {
      SyncFd(in_stack_ffffffffffffffdc,in_RSI);
    }
    else {
      Status::Status((Status *)this_00,local_18);
    }
  }
  else {
    Status::Status((Status *)this_00,local_18);
  }
  Status::~Status((Status *)this_00);
  return (Status)(char *)in_RDI;
}

Assistant:

Status Sync() override {
    // Ensure new files referred to by the manifest are in the filesystem.
    //
    // This needs to happen before the manifest file is flushed to disk, to
    // avoid crashing in a state where the manifest refers to files that are not
    // yet on disk.
    Status status = SyncDirIfManifest();
    if (!status.ok()) {
      return status;
    }

    status = FlushBuffer();
    if (!status.ok()) {
      return status;
    }

    return SyncFd(fd_, filename_);
  }